

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O0

void __thiscall
QNetworkAccessManagerPrivate::_q_replyFinished
          (QNetworkAccessManagerPrivate *this,QNetworkReply *reply)

{
  byte bVar1;
  QVariant *defaultValue;
  ContextType *in_RSI;
  QNetworkAccessManagerPrivate *in_RDI;
  long in_FS_OFFSET;
  QNetworkAccessManager *q;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined8 in_stack_ffffffffffffffa8;
  Attribute code;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  code = (Attribute)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  defaultValue = (QVariant *)q_func(in_RDI);
  QNetworkAccessManager::finished
            ((QNetworkAccessManager *)0x19e2fe,
             (QNetworkReply *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  QNetworkReply::request((QNetworkReply *)in_RSI);
  QVariant::QVariant(&local_48,false);
  QNetworkRequest::attribute((QNetworkRequest *)in_RSI,code,defaultValue);
  bVar1 = QVariant::toBool();
  QVariant::~QVariant(&local_28);
  QVariant::~QVariant(&local_48);
  QNetworkRequest::~QNetworkRequest((QNetworkRequest *)defaultValue);
  if ((bVar1 & 1) != 0) {
    QMetaObject::invokeMethod<QNetworkAccessManagerPrivate::_q_replyFinished(QNetworkReply*)::__0>
              (in_RSI,(anon_class_8_1_a890020a_for_o *)in_RDI,
               (ConnectionType)((ulong)in_RSI >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkAccessManagerPrivate::_q_replyFinished(QNetworkReply *reply)
{
    Q_Q(QNetworkAccessManager);

    emit q->finished(reply);
    if (reply->request().attribute(QNetworkRequest::AutoDeleteReplyOnFinishAttribute, false).toBool())
        QMetaObject::invokeMethod(reply, [reply] { reply->deleteLater(); }, Qt::QueuedConnection);
}